

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_t::add_edge
          (system_t *this,process_id_t pid,loc_id_t src,loc_id_t tgt,event_id_t event_id,
          attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *piVar2;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_161;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_95;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  attributes_t *local_28;
  attributes_t *attributes_local;
  event_id_t event_id_local;
  loc_id_t tgt_local;
  loc_id_t src_local;
  process_id_t pid_local;
  system_t *this_local;
  
  local_28 = attributes;
  attributes_local._0_4_ = event_id;
  attributes_local._4_4_ = tgt;
  event_id_local = src;
  tgt_local = pid;
  _src_local = this;
  bVar1 = processes_t::is_process(&this->super_processes_t,pid);
  if (!bVar1) {
    local_95 = 1;
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_88,tgt_local);
    std::operator+(&local_68,"Process ",&local_88);
    std::operator+(&local_48,&local_68," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_48);
    local_95 = 0;
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = locs_t::is_location(&this->super_locs_t,event_id_local);
  if (!bVar1) {
    local_f9 = 1;
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_f8,event_id_local);
    std::operator+(&local_d8,"Source location ",&local_f8);
    std::operator+(&local_b8,&local_d8," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_b8);
    local_f9 = 0;
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = locs_t::is_location(&this->super_locs_t,attributes_local._4_4_);
  if (!bVar1) {
    local_161 = 1;
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_160,attributes_local._4_4_);
    std::operator+(&local_140,"Traget location ",&local_160);
    std::operator+(&local_120,&local_140," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_120);
    local_161 = 0;
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = events_t::is_event(&this->super_events_t,(event_id_t)attributes_local);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_1c8,(event_id_t)attributes_local);
    std::operator+(&local_1a8,"Event ",&local_1c8);
    std::operator+(&local_188,&local_1a8," is not declared");
    std::invalid_argument::invalid_argument(piVar2,(string *)&local_188);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  edges_t::add_edge(&this->super_edges_t,tgt_local,event_id_local,attributes_local._4_4_,
                    (event_id_t)attributes_local,local_28);
  return;
}

Assistant:

void system_t::add_edge(tchecker::process_id_t pid, tchecker::loc_id_t src, tchecker::loc_id_t tgt,
                        tchecker::event_id_t event_id, tchecker::system::attributes_t const & attributes)
{
  if (!tchecker::system::processes_t::is_process(pid))
    throw std::invalid_argument("Process " + std::to_string(pid) + " is not declared");
  if (!tchecker::system::locs_t::is_location(src))
    throw std::invalid_argument("Source location " + std::to_string(src) + " is not declared");
  if (!tchecker::system::locs_t::is_location(tgt))
    throw std::invalid_argument("Traget location " + std::to_string(tgt) + " is not declared");
  if (!tchecker::system::events_t::is_event(event_id))
    throw std::invalid_argument("Event " + std::to_string(event_id) + " is not declared");
  tchecker::system::edges_t::add_edge(pid, src, tgt, event_id, attributes);
}